

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_slb.c
# Opt level: O0

void * SLB_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *unpkarc;
  PHYSFS_uint32 local_38;
  PHYSFS_uint32 tocPos;
  PHYSFS_uint32 count;
  PHYSFS_uint32 version;
  int *claimed_local;
  char *pcStack_20;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  _count = claimed;
  claimed_local._4_4_ = forWriting;
  pcStack_20 = name;
  name_local = (char *)io;
  if (io != (PHYSFS_Io *)0x0) {
    if (forWriting == 0) {
      iVar1 = __PHYSFS_readAll(io,&tocPos,4);
      if (iVar1 == 0) {
        io_local = (PHYSFS_Io *)0x0;
      }
      else {
        tocPos = PHYSFS_swapULE32(tocPos);
        if (tocPos == 0) {
          iVar1 = __PHYSFS_readAll((PHYSFS_Io *)name_local,&local_38,4);
          if (iVar1 == 0) {
            io_local = (PHYSFS_Io *)0x0;
          }
          else {
            local_38 = PHYSFS_swapULE32(local_38);
            if (local_38 == 0) {
              PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
              io_local = (PHYSFS_Io *)0x0;
            }
            else {
              iVar1 = __PHYSFS_readAll((PHYSFS_Io *)name_local,(void *)((long)&unpkarc + 4),4);
              if (iVar1 == 0) {
                io_local = (PHYSFS_Io *)0x0;
              }
              else {
                unpkarc._4_4_ = PHYSFS_swapULE32(unpkarc._4_4_);
                if (unpkarc._4_4_ == 0) {
                  PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
                  io_local = (PHYSFS_Io *)0x0;
                }
                else {
                  iVar1 = (**(code **)(name_local + 0x20))(name_local,unpkarc._4_4_);
                  if (iVar1 == 0) {
                    io_local = (PHYSFS_Io *)0x0;
                  }
                  else {
                    io_local = (PHYSFS_Io *)UNPK_openArchive((PHYSFS_Io *)name_local);
                    if (io_local == (PHYSFS_Io *)0x0) {
                      io_local = (PHYSFS_Io *)0x0;
                    }
                    else {
                      iVar1 = slbLoadEntries((PHYSFS_Io *)name_local,local_38,io_local);
                      if (iVar1 == 0) {
                        UNPK_abandonArchive(io_local);
                        io_local = (PHYSFS_Io *)0x0;
                      }
                      else {
                        *_count = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
          io_local = (PHYSFS_Io *)0x0;
        }
      }
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
      io_local = (PHYSFS_Io *)0x0;
    }
    return io_local;
  }
  __assert_fail("io != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs_archiver_slb.c"
                ,0x4d,"void *SLB_openArchive(PHYSFS_Io *, const char *, int, int *)");
}

Assistant:

static void *SLB_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint32 version;
    PHYSFS_uint32 count;
    PHYSFS_uint32 tocPos;
    void *unpkarc;

    /* There's no identifier on an SLB file, so we assume it's _not_ if the
       file count or tocPos is zero. Beyond that, we'll assume it's
       bogus/corrupt if the entries' filenames don't start with '\' or the
       tocPos is past the end of the file (seek will fail). This probably
       covers all meaningful cases where we would accidentally accept a non-SLB
       file with this archiver. */

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &version, sizeof (version)), NULL);
    version = PHYSFS_swapULE32(version);
    BAIL_IF(version != 0, PHYSFS_ERR_UNSUPPORTED, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE32(count);
    BAIL_IF(!count, PHYSFS_ERR_UNSUPPORTED, NULL);

    /* offset of the table of contents */
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &tocPos, sizeof (tocPos)), NULL);
    tocPos = PHYSFS_swapULE32(tocPos);
    BAIL_IF(!tocPos, PHYSFS_ERR_UNSUPPORTED, NULL);
    
    /* seek to the table of contents */
    BAIL_IF_ERRPASS(!io->seek(io, tocPos), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!slbLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    *claimed = 1;  /* oh well. */

    return unpkarc;
}